

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlparse.c
# Opt level: O0

char ctrlparse(char *s,char **next)

{
  byte *pbVar1;
  long lVar2;
  byte local_19;
  char c;
  char **next_local;
  char *s_local;
  
  local_19 = 0;
  if (*s == '^') {
    pbVar1 = (byte *)(s + 1);
    if (*pbVar1 == 0) {
      *next = (char *)0x0;
    }
    else if (*pbVar1 == 0x3c) {
      lVar2 = strtol(s + 2,next,0);
      local_19 = (byte)lVar2;
      if ((*next == s + 2) || (**next != '>')) {
        local_19 = 0;
        *next = (char *)0x0;
      }
      else {
        *next = *next + 1;
      }
    }
    else if (((char)*pbVar1 < 'a') || ('z' < (char)*pbVar1)) {
      if ((((char)*pbVar1 < '@') || ('_' < (char)*pbVar1)) &&
         ((*pbVar1 != 0x3f && (((int)(char)*pbVar1 & 0x80U) == 0)))) {
        if (*pbVar1 == 0x7e) {
          local_19 = 0x5e;
          *next = s + 2;
        }
      }
      else {
        local_19 = *pbVar1 ^ 0x40;
        *next = s + 2;
      }
    }
    else {
      local_19 = *pbVar1 + 0xa0;
      *next = s + 2;
    }
  }
  else {
    *next = (char *)0x0;
  }
  return local_19;
}

Assistant:

char ctrlparse(char *s, char **next)
{
    char c = 0;
    if (*s != '^') {
        *next = NULL;
    } else {
        s++;
        if (*s == '\0') {
            *next = NULL;
        } else if (*s == '<') {
            s++;
            c = (char)strtol(s, next, 0);
            if ((*next == s) || (**next != '>')) {
                c = 0;
                *next = NULL;
            } else
                (*next)++;
        } else if (*s >= 'a' && *s <= 'z') {
            c = (*s - ('a' - 1));
            *next = s+1;
        } else if ((*s >= '@' && *s <= '_') || *s == '?' || (*s & 0x80)) {
            c = ('@' ^ *s);
            *next = s+1;
        } else if (*s == '~') {
            c = '^';
            *next = s+1;
        }
    }
    return c;
}